

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFilePathChecksum.cxx
# Opt level: O3

void __thiscall
cmFilePathChecksum::setupParentDirs
          (cmFilePathChecksum *this,string *currentSrcDir,string *currentBinDir,
          string *projectSrcDir,string *projectBinDir)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_50;
  
  cmsys::SystemTools::GetRealPath(&local_50,currentSrcDir,(string *)0x0);
  std::__cxx11::string::operator=((string *)this,(string *)&local_50);
  paVar1 = &local_50.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  cmsys::SystemTools::GetRealPath(&local_50,currentBinDir,(string *)0x0);
  std::__cxx11::string::operator=((string *)((this->parentDirs)._M_elems + 1),(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  cmsys::SystemTools::GetRealPath(&local_50,projectSrcDir,(string *)0x0);
  std::__cxx11::string::operator=((string *)((this->parentDirs)._M_elems + 2),(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  cmsys::SystemTools::GetRealPath(&local_50,projectBinDir,(string *)0x0);
  std::__cxx11::string::operator=((string *)((this->parentDirs)._M_elems + 3),(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&(this->parentDirs)._M_elems[0].second,0,
             (char *)(this->parentDirs)._M_elems[0].second._M_string_length,0x8cd270);
  std::__cxx11::string::_M_replace
            ((ulong)&(this->parentDirs)._M_elems[1].second,0,
             (char *)(this->parentDirs)._M_elems[1].second._M_string_length,0x8cd27e);
  std::__cxx11::string::_M_replace
            ((ulong)&(this->parentDirs)._M_elems[2].second,0,
             (char *)(this->parentDirs)._M_elems[2].second._M_string_length,0x8cd28c);
  std::__cxx11::string::_M_replace
            ((ulong)&(this->parentDirs)._M_elems[3].second,0,
             (char *)(this->parentDirs)._M_elems[3].second._M_string_length,0x8cd29a);
  return;
}

Assistant:

void cmFilePathChecksum::setupParentDirs(std::string const& currentSrcDir,
                                         std::string const& currentBinDir,
                                         std::string const& projectSrcDir,
                                         std::string const& projectBinDir)
{
  this->parentDirs[0].first = cmSystemTools::GetRealPath(currentSrcDir);
  this->parentDirs[1].first = cmSystemTools::GetRealPath(currentBinDir);
  this->parentDirs[2].first = cmSystemTools::GetRealPath(projectSrcDir);
  this->parentDirs[3].first = cmSystemTools::GetRealPath(projectBinDir);

  this->parentDirs[0].second = "CurrentSource";
  this->parentDirs[1].second = "CurrentBinary";
  this->parentDirs[2].second = "ProjectSource";
  this->parentDirs[3].second = "ProjectBinary";
}